

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

long ossl_bio_cf_ctrl(BIO *bio,int cmd,long num,void *ptr)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  
  lVar2 = BIO_get_data();
  uVar3 = 1;
  switch(cmd) {
  case 2:
    if (*(long *)(lVar2 + 8) != 0) {
      uVar3 = (ulong)(~*(uint *)(*(long *)(lVar2 + 8) + 0x24) & 1);
    }
    break;
  default:
    uVar3 = 0;
    break;
  case 8:
    iVar1 = BIO_get_shutdown(bio);
    uVar3 = (ulong)iVar1;
    break;
  case 9:
    BIO_set_shutdown(bio,num & 0xffffffff);
    break;
  case 0xb:
  case 0xc:
    break;
  }
  return uVar3;
}

Assistant:

static long ossl_bio_cf_ctrl(BIO *bio, int cmd, long num, void *ptr)
{
  struct Curl_cfilter *cf = BIO_get_data(bio);
  long ret = 1;

  (void)cf;
  (void)ptr;
  switch(cmd) {
  case BIO_CTRL_GET_CLOSE:
    ret = (long)BIO_get_shutdown(bio);
    break;
  case BIO_CTRL_SET_CLOSE:
    BIO_set_shutdown(bio, (int)num);
    break;
  case BIO_CTRL_FLUSH:
    /* we do no delayed writes, but if we ever would, this
     * needs to trigger it. */
    ret = 1;
    break;
  case BIO_CTRL_DUP:
    ret = 1;
    break;
#ifdef BIO_CTRL_EOF
  case BIO_CTRL_EOF:
    /* EOF has been reached on input? */
    return (!cf->next || !cf->next->connected);
#endif
  default:
    ret = 0;
    break;
  }
  return ret;
}